

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

ps_astar_t *
ps_astar_start(ps_lattice_t *dag,ngram_model_t *lmset,float32 lwf,int sf,int ef,int w1,int w2)

{
  float fVar1;
  ngram_model_t *model;
  int iVar2;
  ps_astar_t *nbest;
  listelem_alloc_t *plVar3;
  ps_latnode_t *ppVar4;
  ps_latpath_t *newpath;
  int32 n_used;
  int32 local_34;
  
  nbest = (ps_astar_t *)
          __ckd_calloc__(1,0x60,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                         ,0x6bb);
  nbest->dag = dag;
  nbest->lmset = lmset;
  nbest->lwf = lwf;
  nbest->sf = sf;
  if (ef < 0) {
    ef = dag->n_frames + 1;
  }
  nbest->ef = ef;
  nbest->w1 = w1;
  nbest->w2 = w2;
  plVar3 = listelem_alloc_init(0x20);
  nbest->latpath_alloc = plVar3;
  for (ppVar4 = dag->nodes; ppVar4 != (ps_latnode_t *)0x0; ppVar4 = ppVar4->next) {
    if (ppVar4 == dag->end) {
      (ppVar4->info).fanin = 0;
    }
    else if (ppVar4->exits == (latlink_list_t *)0x0) {
      (ppVar4->info).fanin = -0x20000000;
    }
    else {
      (ppVar4->info).fanin = 1;
    }
  }
  nbest->path_list = (ps_latpath_t *)0x0;
  nbest->path_tail = (ps_latpath_t *)0x0;
  for (ppVar4 = dag->nodes; ppVar4 != (ps_latnode_t *)0x0; ppVar4 = ppVar4->next) {
    if (ppVar4->sf == sf) {
      best_rem_score(nbest,ppVar4);
      newpath = (ps_latpath_t *)
                __listelem_malloc__(nbest->latpath_alloc,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                    ,0x6da);
      newpath->node = ppVar4;
      newpath->parent = (ps_latpath_s *)0x0;
      model = nbest->lmset;
      if (model == (ngram_model_t *)0x0) {
        iVar2 = 0;
      }
      else {
        fVar1 = (float)nbest->lwf;
        if (w1 < 0) {
          iVar2 = ngram_bg_score(model,ppVar4->basewid,w2,&local_34);
        }
        else {
          iVar2 = ngram_tg_score(model,ppVar4->basewid,w2,w1,&local_34);
        }
        iVar2 = (int)(fVar1 * (float)iVar2) >> 10;
      }
      newpath->score = iVar2;
      path_insert(nbest,newpath,iVar2 + (ppVar4->info).fanin);
    }
  }
  return nbest;
}

Assistant:

ps_astar_t *
ps_astar_start(ps_lattice_t *dag,
                  ngram_model_t *lmset,
                  float32 lwf,
                  int sf, int ef,
                  int w1, int w2)
{
    ps_astar_t *nbest;
    ps_latnode_t *node;

    nbest = ckd_calloc(1, sizeof(*nbest));
    nbest->dag = dag;
    nbest->lmset = lmset;
    nbest->lwf = lwf;
    nbest->sf = sf;
    if (ef < 0)
        nbest->ef = dag->n_frames + 1;
    else
        nbest->ef = ef;
    nbest->w1 = w1;
    nbest->w2 = w2;
    nbest->latpath_alloc = listelem_alloc_init(sizeof(ps_latpath_t));

    /* Initialize rem_score (A* heuristic) to default values */
    for (node = dag->nodes; node; node = node->next) {
        if (node == dag->end)
            node->info.rem_score = 0;
        else if (node->exits == NULL)
            node->info.rem_score = WORST_SCORE;
        else
            node->info.rem_score = 1;   /* +ve => unknown value */
    }

    /* Create initial partial hypotheses list consisting of nodes starting at sf */
    nbest->path_list = nbest->path_tail = NULL;
    for (node = dag->nodes; node; node = node->next) {
        if (node->sf == sf) {
            ps_latpath_t *path;
            int32 n_used;

            best_rem_score(nbest, node);
            path = listelem_malloc(nbest->latpath_alloc);
            path->node = node;
            path->parent = NULL;
            if (nbest->lmset)
                path->score = nbest->lwf *
                    ((w1 < 0)
                    ? ngram_bg_score(nbest->lmset, node->basewid, w2, &n_used)
                    : ngram_tg_score(nbest->lmset, node->basewid, w2, w1, &n_used));
            else
                path->score = 0;
            path->score >>= SENSCR_SHIFT;
            path_insert(nbest, path, path->score + node->info.rem_score);
        }
    }

    return nbest;
}